

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O1

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::AllocateObjectSynchData
          (CPalSynchronizationManager *this,CObjectType *potObjectType,ObjectDomain odObjectDomain,
          VOID **ppvSynchData)

{
  CSynchData *pCVar1;
  PAL_ERROR PVar2;
  CPalThread *pthrCurrent;
  CSynchData *pCVar3;
  CSynchData *local_38;
  SHMPTR shridObj;
  
  pthrCurrent = (CPalThread *)pthread_getspecific(thObjKey);
  if (pthrCurrent == (CPalThread *)0x0) {
    pthrCurrent = CreateCurrentThreadData();
  }
  if (odObjectDomain == SharedObject) {
    local_38 = (CSynchData *)0x0;
    CSHRSynchCache<CorUnix::CSynchData>::Get
              (&this->m_cacheSHRSynchData,pthrCurrent,1,(SHMPTR *)&local_38);
    pCVar1 = local_38;
    if (local_38 == (CSynchData *)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00347e9d;
      PVar2 = 8;
      pCVar3 = (CSynchData *)0x0;
    }
    else {
      pCVar3 = (CSynchData *)SHMPtrToPtr((SHMPTR)local_38);
      if (pCVar3 == (CSynchData *)0x0) {
        fprintf(_stderr,"] %s %s:%d","AllocateObjectSynchData",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                ,0x416);
        fprintf(_stderr,"Expression: NULL != psdSynchData, Description: Bad shared memory pointer\n"
               );
      }
      (pCVar3->m_ptrWTLHead).shrid = 0;
      (pCVar3->m_ptrWTLTail).shrid = 0;
      pCVar3->m_shridThis = (SHMPTR)pCVar1;
      *ppvSynchData = pCVar1;
      PVar2 = 0;
    }
    local_38 = pCVar3;
    if (pCVar1 == (CSynchData *)0x0) {
      return PVar2;
    }
  }
  else {
    local_38 = (CSynchData *)0x0;
    CSynchCache<CorUnix::CSynchData>::Get(&this->m_cacheSynchData,pthrCurrent,1,&local_38);
    if (local_38 == (CSynchData *)0x0) {
      if (PAL_InitializeChakraCoreCalled != false) {
        return 8;
      }
LAB_00347e9d:
      abort();
    }
    (local_38->m_ptrWTLHead).shrid = 0;
    (local_38->m_ptrWTLTail).shrid = 0;
    local_38->m_shridThis = 0;
    *ppvSynchData = local_38;
    PVar2 = 0;
  }
  local_38->m_odObjectDomain = odObjectDomain;
  local_38->m_otiObjectTypeId = potObjectType->m_eTypeId;
  return PVar2;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::AllocateObjectSynchData(
        CObjectType *potObjectType,
        ObjectDomain odObjectDomain,
        VOID **ppvSynchData)
    {
        PAL_ERROR palErr = NO_ERROR;
        CSynchData * psdSynchData = NULL;
        CPalThread * pthrCurrent = InternalGetCurrentThread();

        if (SharedObject == odObjectDomain)
        {
            SharedID shridSynchData = m_cacheSHRSynchData.Get(pthrCurrent);
            if (NULLSharedID == shridSynchData)
            {
                ERROR("Unable to allocate shared memory\n");
                palErr = ERROR_NOT_ENOUGH_MEMORY;
                goto AOSD_exit;
            }
            psdSynchData = SharedIDToTypePointer(CSynchData, shridSynchData);

            VALIDATEOBJECT(psdSynchData);

            _ASSERT_MSG(NULL != psdSynchData, "Bad shared memory pointer\n");

            // Initialize waiting list pointers
            psdSynchData->SetWTLHeadShrPtr(NULLSharedID);
            psdSynchData->SetWTLTailShrPtr(NULLSharedID);

            // Store shared pointer to this object
            psdSynchData->SetSharedThis(shridSynchData);

            *ppvSynchData = reinterpret_cast<void *>(shridSynchData);
        }
        else
        {
            psdSynchData = m_cacheSynchData.Get(pthrCurrent);
            if (NULL == psdSynchData)
            {
                ERROR("Unable to allocate memory\n");
                palErr = ERROR_NOT_ENOUGH_MEMORY;
                goto AOSD_exit;
            }

            // Initialize waiting list pointers
            psdSynchData->SetWTLHeadPtr(NULL);
            psdSynchData->SetWTLTailPtr(NULL);

            // Set shared this pointer to NULL
            psdSynchData->SetSharedThis(NULLSharedID);

            *ppvSynchData = static_cast<void *>(psdSynchData);
        }

        // Initialize object domain and object type;
        psdSynchData->SetObjectDomain(odObjectDomain);
        psdSynchData->SetObjectType(potObjectType);

    AOSD_exit:
        return palErr;
    }